

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O0

string * __thiscall
BayesianGameCollaborativeGraphical::SoftPrintSummary_abi_cxx11_
          (BayesianGameCollaborativeGraphical *this)

{
  ostream *poVar1;
  long in_RSI;
  string *in_RDI;
  BayesianGameBase *in_stack_00000008;
  Index e;
  stringstream ss;
  ostream *in_stack_fffffffffffffdc8;
  const_reference in_stack_fffffffffffffdd0;
  string local_1e8 [32];
  uint local_1c8;
  string local_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [240];
  Scope *in_stack_ffffffffffffff68;
  
  std::__cxx11::stringstream::stringstream(local_198);
  BayesianGameBase::SoftPrintSummary_abi_cxx11_(in_stack_00000008);
  std::operator<<(local_188,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  for (local_1c8 = 0; (ulong)local_1c8 < *(ulong *)(in_RSI + 0xd8); local_1c8 = local_1c8 + 1) {
    poVar1 = std::operator<<(local_188,"LRF function ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c8);
    poVar1 = std::operator<<(poVar1,":");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(local_188,"Agent scope ");
    in_stack_fffffffffffffdd0 =
         std::vector<Scope,_std::allocator<Scope>_>::at
                   ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffdd0,
                    (size_type)in_stack_fffffffffffffdc8);
    PrintTools::SoftPrintVector<Scope>(in_stack_ffffffffffffff68);
    in_stack_fffffffffffffdc8 = std::operator<<(poVar1,local_1e8);
    std::ostream::operator<<(in_stack_fffffffffffffdc8,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1e8);
    std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string BayesianGameCollaborativeGraphical::SoftPrintSummary() const
{
    stringstream ss;
    ss << BayesianGameBase::SoftPrintSummary();    
    for(Index e=0; e < _m_nrLRFs; e++)
    {
        ss << "LRF function " << e << ":" << endl;
        ss << "Agent scope " << SoftPrintVector(_m_agentScopes.at(e)) << endl;
        //ss << _m_LRFs.at(e)->SoftPrint();
        ss << endl;
    }
    return(ss.str());
}